

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pipe.c
# Opt level: O3

char * nni_pipe_peer_addr(nni_pipe *p,char *buf)

{
  undefined1 local_a8 [8];
  nng_sockaddr sa;
  size_t sz;
  
  sa.s_storage.sa_pad[0xf] = 0x88;
  local_a8._0_2_ = 0;
  nni_pipe_getopt(p,"remote-address",(nng_sockaddr *)local_a8,sa.s_storage.sa_pad + 0xf,
                  NNI_TYPE_SOCKADDR);
  nng_str_sockaddr((nng_sockaddr *)local_a8,buf,0x90);
  return buf;
}

Assistant:

char *
nni_pipe_peer_addr(nni_pipe *p, char buf[NNG_MAXADDRSTRLEN])
{
	nng_sockaddr sa;
	size_t       sz = sizeof(sa);
	sa.s_family     = AF_UNSPEC;
	nni_pipe_getopt(p, NNG_OPT_REMADDR, &sa, &sz, NNI_TYPE_SOCKADDR);
	nng_str_sockaddr(&sa, buf, NNG_MAXADDRSTRLEN);
	return (buf);
}